

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u64 sqlite3LogEstToInt(LogEst x)

{
  short sVar1;
  undefined8 local_20;
  u64 n;
  LogEst x_local;
  undefined8 local_8;
  
  n = (u64)((int)x % 10);
  sVar1 = x / 10;
  if (n < 5) {
    if (n != 0) {
      n = n - 1;
    }
  }
  else {
    n = n - 2;
  }
  if (sVar1 < 0x3d) {
    if (sVar1 < 3) {
      local_20 = n + 8 >> (3U - (char)sVar1 & 0x3f);
    }
    else {
      local_20 = n + 8 << ((char)sVar1 - 3U & 0x3f);
    }
    local_8 = local_20;
  }
  else {
    local_8 = 0x7fffffffffffffff;
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE u64 sqlite3LogEstToInt(LogEst x){
  u64 n;
  n = x%10;
  x /= 10;
  if( n>=5 ) n -= 2;
  else if( n>=1 ) n -= 1;
  if( x>60 ) return (u64)LARGEST_INT64;
  return x>=3 ? (n+8)<<(x-3) : (n+8)>>(3-x);
}